

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdtd.h
# Opt level: O0

void dump_fdtd(fdtd *fdtd,char *fileName,dumpable_data dd)

{
  int iVar1;
  int *in_RDI;
  char *in_stack_00000018;
  undefined4 in_stack_00000020;
  dumpable_data in_stack_00000024;
  char *in_stack_00000028;
  fdtd3D *in_stack_00000030;
  
  iVar1 = *in_RDI;
  if (iVar1 == 0) {
    dump_1D_fdtd((fdtd1D *)fdtd,fileName,dd);
  }
  else if (iVar1 == 1) {
    dump_2D_fdtd((fdtd2D *)CONCAT44(in_stack_00000024,in_stack_00000020),in_stack_00000018,
                 fdtd._4_4_);
  }
  else if (iVar1 == 2) {
    dump_3D_fdtd(in_stack_00000030,in_stack_00000028,in_stack_00000024);
  }
  return;
}

Assistant:

inline void dump_fdtd(const struct fdtd *fdtd, const char *fileName,
                      enum dumpable_data dd) {
  switch (fdtd->type) {
  case fdtd_one_dim:
    dump_1D_fdtd(&fdtd->oneDim, fileName, dd);
    break;
  case fdtd_two_dims:
    dump_2D_fdtd(&fdtd->twoDims, fileName, dd);
    break;
  case fdtd_three_dims:
    dump_3D_fdtd(&fdtd->threeDims, fileName, dd);
    break;
  }
}